

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::bin_writer<3>_>
             *this,wchar_t **it)

{
  size_t sVar1;
  wchar_t *pwVar2;
  wchar_t *in_RSI;
  basic_string_view<char> *in_RDI;
  wchar_t *unaff_retaddr;
  char *in_stack_00000008;
  wchar_t **in_stack_ffffffffffffffd8;
  bin_writer<3> *in_stack_ffffffffffffffe0;
  basic_string_view<char> *__result;
  
  __result = in_RDI;
  sVar1 = basic_string_view<char>::size(in_RDI);
  if (sVar1 != 0) {
    in_stack_ffffffffffffffe0 = (bin_writer<3> *)basic_string_view<char>::data(in_RDI);
    basic_string_view<char>::size(in_RDI);
    pwVar2 = std::copy_n<char_const*,unsigned_long,wchar_t*>
                       (in_stack_00000008,(unsigned_long)unaff_retaddr,(wchar_t *)__result);
    *(wchar_t **)in_RSI = pwVar2;
  }
  pwVar2 = std::fill_n<wchar_t*,unsigned_long,wchar_t>(unaff_retaddr,(unsigned_long)__result,in_RSI)
  ;
  *(wchar_t **)in_RSI = pwVar2;
  int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>::operator()
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = std::copy_n(prefix.data(), prefix.size(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }